

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCache.cpp
# Opt level: O0

Lexeme * BinaryCache::FindLexems(char *moduleName,bool addExtension,uint *count)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  Lexeme *pLVar4;
  Lexeme *lexems;
  uint e;
  uint i;
  char *pathNoImport;
  char *pathEnd;
  char *modulePath;
  char local_438 [4];
  uint modulePathPos;
  char path [1024];
  uint pathLength;
  uint *count_local;
  bool addExtension_local;
  char *moduleName_local;
  
  if (addExtension) {
    pcVar2 = strstr(moduleName,".nc");
    if (pcVar2 != (char *)0x0) {
      __assert_fail("strstr(moduleName, \".nc\") == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/BinaryCache.cpp"
                    ,0xe3,"Lexeme *BinaryCache::FindLexems(const char *, bool, unsigned int &)");
    }
  }
  else {
    pcVar2 = strstr(moduleName,".nc");
    if (pcVar2 == (char *)0x0) {
      __assert_fail("strstr(moduleName, \".nc\") != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/BinaryCache.cpp"
                    ,0xe5,"Lexeme *BinaryCache::FindLexems(const char *, bool, unsigned int &)");
    }
  }
  modulePath._4_4_ = 0;
  do {
    pcVar2 = EnumImportPath(modulePath._4_4_);
    if (pcVar2 == (char *)0x0) {
      return (Lexeme *)0x0;
    }
    iVar1 = NULLC::SafeSprintf(local_438,0x400,"%s%s",pcVar2,moduleName);
    if (addExtension) {
      sVar3 = strlen(pcVar2);
      pcVar2 = local_438 + sVar3;
      lexems._4_4_ = 0;
      sVar3 = strlen(pcVar2);
      for (; lexems._4_4_ != (uint)sVar3; lexems._4_4_ = lexems._4_4_ + 1) {
        if (pcVar2[lexems._4_4_] == '.') {
          pcVar2[lexems._4_4_] = '/';
        }
      }
      NULLC::SafeSprintf(local_438 + iVar1,
                         (ulong)(0x400 - ((int)(local_438 + iVar1) - (int)local_438)),".nc");
    }
    pLVar4 = GetLexems(local_438,count);
    modulePath._4_4_ = modulePath._4_4_ + 1;
  } while (pLVar4 == (Lexeme *)0x0);
  return pLVar4;
}

Assistant:

Lexeme* BinaryCache::FindLexems(const char* moduleName, bool addExtension, unsigned& count)
{
	if(addExtension)
		assert(strstr(moduleName, ".nc") == 0);
	else
		assert(strstr(moduleName, ".nc") != 0);

	const unsigned pathLength = 1024;
	char path[pathLength];

	unsigned modulePathPos = 0;
	while(const char *modulePath = BinaryCache::EnumImportPath(modulePathPos++))
	{
		char *pathEnd = path + NULLC::SafeSprintf(path, pathLength, "%s%s", modulePath, moduleName);

		if(addExtension)
		{
			char *pathNoImport = path + strlen(modulePath);

			for(unsigned i = 0, e = (unsigned)strlen(pathNoImport); i != e; i++)
			{
				if(pathNoImport[i] == '.')
					pathNoImport[i] = '/';
			}

			NULLC::SafeSprintf(pathEnd, pathLength - int(pathEnd - path), ".nc");
		}

		if(Lexeme *lexems = BinaryCache::GetLexems(path, count))
			return lexems;
	}

	return NULL;
}